

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<float> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  int iVar1;
  locale_ref loc_00;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  basic_appender<char> bVar8;
  uint uVar9;
  size_t n;
  int iVar10;
  int iVar11;
  digit_grouping<char> *this;
  ulong uVar12;
  long lVar13;
  undefined6 uStack_118;
  char local_112;
  char zero;
  bool pointy;
  undefined3 uStack_10f;
  int significand_size;
  significand_type significand;
  sign s_local;
  basic_appender<char> local_100;
  ulong local_f8;
  locale_ref local_f0;
  int local_e4;
  significand_type local_e0;
  sign local_dc;
  int local_d8;
  int exp;
  anon_class_28_8_ce6b8c4d write;
  undefined4 uStack_b4;
  int num_zeros;
  undefined4 uStack_84;
  significand_type *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  digit_grouping<char> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_class_24_3_3ccdf9fd use_exp_format;
  
  significand = f->significand;
  s_local = s;
  local_100.container = out.container;
  local_e0 = significand;
  local_d8 = exp_upper;
  iVar5 = get_significand_size<float>(f);
  local_f8 = (ulong)((iVar5 + 1) - (uint)(s == none));
  zero = '0';
  cVar3 = '.';
  significand_size = iVar5;
  local_dc = s;
  if (((specs->super_basic_specs).data_ & 0x4000) != 0) {
    loc_00.locale_._6_1_ = local_112;
    loc_00.locale_._0_6_ = uStack_118;
    loc_00.locale_._7_1_ = 0x30;
    cVar3 = decimal_point_impl<char>(loc_00);
  }
  iVar10 = f->exponent;
  local_e4 = iVar5 + iVar10 + -1;
  use_exp_format.specs.super_basic_specs = specs->super_basic_specs;
  use_exp_format.specs.width = specs->width;
  use_exp_format.specs.precision = specs->precision;
  use_exp_format.exp_upper = local_d8;
  local_112 = cVar3;
  local_f0.locale_ = loc.locale_;
  use_exp_format.output_exp = local_e4;
  bVar4 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
          ::anon_class_24_3_3ccdf9fd::operator()(&use_exp_format);
  uVar2 = write._16_8_;
  if (bVar4) {
    iVar10 = iVar10 + iVar5;
    uVar6 = (specs->super_basic_specs).data_;
    if ((uVar6 >> 0xd & 1) == 0) {
      uVar7 = 0;
      uVar12 = local_f8;
      if (iVar5 == 1) {
        cVar3 = '\0';
      }
    }
    else {
      uVar9 = specs->precision - iVar5;
      uVar7 = 0;
      if (0 < (int)uVar9) {
        uVar7 = (ulong)uVar9;
      }
      uVar12 = local_f8 + uVar7;
    }
    iVar11 = 1 - iVar10;
    if (0 < iVar10) {
      iVar11 = local_e4;
    }
    lVar13 = 2;
    if (99 < iVar11) {
      lVar13 = (ulong)(999 < iVar11) + 3;
    }
    n = (3 - (ulong)(cVar3 == '\0')) + uVar12 + lVar13;
    write.significand = local_e0;
    write.s = local_dc;
    write.decimal_point = cVar3;
    write.significand_size = iVar5;
    write._16_5_ = CONCAT14('0',(int)uVar7);
    write._22_2_ = SUB82(uVar2,6);
    write._16_8_ = CONCAT26(write._22_2_,CONCAT15(((uVar6 >> 0xc & 1) == 0) << 5,write._16_5_)) |
                   0x450000000000;
    write.output_exp = local_e4;
    if (0 < specs->width) {
      bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (local_100,specs,n,&write);
      return (basic_appender<char>)bVar8.container;
    }
    bVar8 = reserve<char>(local_100,n);
    bVar8 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
            ::anon_class_28_8_ce6b8c4d::operator()(&write,bVar8.container);
    return (basic_appender<char>)bVar8.container;
  }
  iVar10 = f->exponent;
  iVar11 = iVar5 + iVar10;
  exp = iVar11;
  if (-1 < (long)iVar10) {
    lVar13 = (long)iVar10 + local_f8;
    _pointy = specs->precision - iVar11;
    uVar6 = (specs->super_basic_specs).data_;
    if ((uVar6 >> 0xd & 1) != 0) {
      lVar13 = lVar13 + 1;
      if ((uVar6 & 7) == 2 || 0 < (int)_pointy) {
        if (0 < (int)_pointy) {
          lVar13 = lVar13 + (ulong)_pointy;
        }
      }
      else {
        _pointy = 0;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&num_zeros,local_f0,(bool)((byte)(uVar6 >> 0xe) & 1));
    uVar6 = digit_grouping<char>::count_separators((digit_grouping<char> *)&num_zeros,iVar11);
    write._0_8_ = &s_local;
    write._8_8_ = &significand;
    write._16_8_ = &significand_size;
    unique0x10000470 = f;
    bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_>
                      (local_100,specs,lVar13 + (ulong)uVar6,(anon_class_72_9_eb40e20e *)&write);
    this = (digit_grouping<char> *)&num_zeros;
LAB_002fe481:
    digit_grouping<char>::~digit_grouping(this);
    return (basic_appender<char>)bVar8.container;
  }
  if (0 < iVar11) {
    uVar6 = (specs->super_basic_specs).data_;
    uVar9 = specs->precision - iVar5 & (int)(uVar6 << 0x12) >> 0x1f;
    _pointy = uVar9;
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&write,local_f0,(bool)((byte)(uVar6 >> 0xe) & 1));
    uVar6 = digit_grouping<char>::count_separators((digit_grouping<char> *)&write,iVar11);
    uVar7 = 0;
    if (0 < (int)uVar9) {
      uVar7 = (ulong)uVar9;
    }
    _num_zeros = (pointer)&s_local;
    local_80 = &significand;
    local_78._M_allocated_capacity = (size_type)&significand_size;
    local_78._8_8_ = &exp;
    local_68._M_p = &local_112;
    local_58._M_allocated_capacity = (size_type)&pointy;
    local_58._8_8_ = &zero;
    local_60 = (digit_grouping<char> *)&write;
    bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_>
                      (local_100,specs,(ulong)uVar6 + uVar7 + local_f8 + 1,
                       (anon_class_64_8_085c650e *)&num_zeros);
    this = (digit_grouping<char> *)&write;
    goto LAB_002fe481;
  }
  iVar10 = -iVar11;
  num_zeros = iVar10;
  if ((iVar5 == 0) &&
     (iVar1 = specs->precision, SBORROW4(iVar1,iVar10) != iVar1 + iVar11 < 0 && -1 < iVar1)) {
    num_zeros = iVar1;
    iVar10 = iVar1;
  }
  if (iVar5 == 0 && iVar10 == 0) {
    uVar6 = (specs->super_basic_specs).data_ & 0x2000;
    _pointy = CONCAT31(uStack_10f,(char)(uVar6 >> 0xd));
    if (uVar6 == 0) {
      iVar5 = 1;
      goto LAB_002fe4df;
    }
  }
  else {
    _pointy = CONCAT31(uStack_10f,1);
  }
  iVar5 = 2;
LAB_002fe4df:
  write._0_8_ = &s_local;
  write._8_8_ = &pointy;
  write._16_8_ = &local_112;
  unique0x00005300 = &num_zeros;
  bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_>
                    (local_100,specs,(uint)(iVar5 + iVar10) + local_f8,
                     (anon_class_56_7_88befd79 *)&write);
  return (basic_appender<char>)bVar8.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}